

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

int __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
::
AddConstraint<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
          (ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
           *this,int d,
          CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>
          *args)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int local_c;
  
  local_c = d;
  std::
  deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>::Container,std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>::Container>>
  ::
  emplace_back<int&,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>
            ((deque<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>::Container,std::allocator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::IfThenId>>::Container>>
              *)(this + 0xd0),&local_c,args);
  lVar1 = *(long *)(this + 0x118);
  lVar2 = *(long *)(this + 0x100);
  uVar3 = lVar2 - *(long *)(this + 0x108);
  if (uVar3 == 0) {
    lVar2 = *(long *)(lVar1 + -8) + 0x1f8;
  }
  ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
  ::ExportConstraint((ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::IfThenId>_>
                      *)this,(int)(uVar3 >> 3) * 0x38e38e39 +
                             ((int)((ulong)(lVar1 - *(long *)(this + 0xf8)) >> 3) + -1 +
                             (uint)(lVar1 == 0)) * 7 +
                             (int)((ulong)(*(long *)(this + 0xf0) - *(long *)(this + 0xe0)) >> 3) *
                             0x38e38e39 + -1,(Container *)(lVar2 + -0x48));
  return (int)((ulong)(*(long *)(this + 0xf0) - *(long *)(this + 0xe0)) >> 3) * 0x38e38e39 +
         (int)((ulong)(*(long *)(this + 0x100) - *(long *)(this + 0x108)) >> 3) * 0x38e38e39 +
         ((int)((ulong)(*(long *)(this + 0x118) - *(long *)(this + 0xf8)) >> 3) + -1 +
         (uint)(*(long *)(this + 0x118) == 0)) * 7 + -1;
}

Assistant:

int AddConstraint(int d, Args&&... args)
  {
    cons_.emplace_back( d, std::move(args)... );
    ExportConstraint(cons_.size()-1, cons_.back());
    // fmt::MemoryWriter wrt;
    // WriteCon2JSON(wrt, cons_.size()-1, cons_.back());
    // printf("%s\n", wrt.c_str());
    return cons_.size()-1;
  }